

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_Proto3_Test::~DynamicMessageTest_Proto3_Test
          (DynamicMessageTest_Proto3_Test *this)

{
  (this->super_DynamicMessageTest).super_TestWithParam<std::tuple<bool,_bool>_>.super_Test.
  _vptr_Test = (_func_int **)&PTR__DynamicMessageTest_0188d858;
  (this->super_DynamicMessageTest).super_TestWithParam<std::tuple<bool,_bool>_>.
  super_WithParamInterface<std::tuple<bool,_bool>_>._vptr_WithParamInterface =
       (_func_int **)&PTR__DynamicMessageTest_0188d898;
  DynamicMessageFactory::~DynamicMessageFactory(&(this->super_DynamicMessageTest).factory_);
  DescriptorPool::~DescriptorPool(&(this->super_DynamicMessageTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x130);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Proto3) {
  Message* message = proto3_prototype_->New();
  const Reflection* refl = message->GetReflection();
  const Descriptor* desc = message->GetDescriptor();

  // Just test a single primitive and single message field here to make sure we
  // are getting the no-field-presence semantics elsewhere. DynamicMessage uses
  // GeneratedMessageReflection under the hood, so the rest should be fine as
  // long as GMR recognizes that we're using a proto3 message.
  const FieldDescriptor* optional_int32 =
      desc->FindFieldByName("optional_int32");
  const FieldDescriptor* optional_msg =
      desc->FindFieldByName("optional_nested_message");
  EXPECT_TRUE(optional_int32 != nullptr);
  EXPECT_TRUE(optional_msg != nullptr);

  EXPECT_EQ(false, refl->HasField(*message, optional_int32));
  refl->SetInt32(message, optional_int32, 42);
  EXPECT_EQ(true, refl->HasField(*message, optional_int32));
  refl->SetInt32(message, optional_int32, 0);
  EXPECT_EQ(false, refl->HasField(*message, optional_int32));

  EXPECT_EQ(false, refl->HasField(*message, optional_msg));
  refl->MutableMessage(message, optional_msg);
  EXPECT_EQ(true, refl->HasField(*message, optional_msg));
  delete refl->ReleaseMessage(message, optional_msg);
  EXPECT_EQ(false, refl->HasField(*message, optional_msg));

  // Also ensure that the default instance handles field presence properly.
  EXPECT_EQ(false, refl->HasField(*proto3_prototype_, optional_msg));

  delete message;
}